

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::received_bytes
          (session_impl *this,int bytes_payload,int bytes_protocol)

{
  counters::inc_stats_counter(&this->m_stats_counters,0x84,(long)(bytes_protocol + bytes_payload));
  counters::inc_stats_counter(&this->m_stats_counters,0x83,(long)bytes_payload);
  stat::received_bytes(&this->m_stat,bytes_payload,bytes_protocol);
  return;
}

Assistant:

void session_impl::received_bytes(int bytes_payload, int bytes_protocol)
	{
		TORRENT_ASSERT(bytes_payload >= 0);
		TORRENT_ASSERT(bytes_protocol >= 0);
		m_stats_counters.inc_stats_counter(counters::recv_bytes
			, bytes_payload + bytes_protocol);
		m_stats_counters.inc_stats_counter(counters::recv_payload_bytes
			, bytes_payload);

		m_stat.received_bytes(bytes_payload, bytes_protocol);
	}